

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O3

Float<unsigned_int,_5,_6,_15,_2U>
tcu::Float<unsigned_int,5,6,15,2u>::convert<unsigned_long,11,52,1023,3u>
          (Float<unsigned_long,_11,_52,_1023,_3U> *other)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar2 = other->m_value;
  if (-1 < (long)uVar2) {
    if (uVar2 == 0x7ff0000000000000) {
      return (Float<unsigned_int,_5,_6,_15,_2U>)0x7c0;
    }
    uVar5 = uVar2 & 0xfffffffffffff;
    if ((uVar2 & 0x7ff0000000000000) == 0x7ff0000000000000 && uVar5 != 0) {
      return (Float<unsigned_int,_5,_6,_15,_2U>)0x7ff;
    }
    if (uVar2 != 0) {
      if ((uVar2 & 0x7ff0000000000000) == 0 && uVar5 != 0) {
        lVar1 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar5 = uVar5 << (~(byte)lVar1 + 0x35 & 0x3f);
        uVar3 = ((uint)lVar1 ^ 0xffffffc0) - 0x3f2;
      }
      else {
        uVar3 = (uint)(uVar2 >> 0x34) - 0x3ff;
        uVar5 = uVar5 | 0x10000000000000;
      }
      if ((int)uVar3 < -0xe) {
        if (uVar3 < 0xffffffeb) {
          return (Float<unsigned_int,_5,_6,_15,_2U>)0;
        }
        return (Float<unsigned_int,_5,_6,_15,_2U>)
               (StorageType)
               (~(-1L << (0x1fU - (char)uVar3 & 0x3f)) + uVar5 +
                (ulong)((uVar5 >> ((ulong)(0x20 - uVar3) & 0x3f) & 1) != 0) >>
               ((byte)(0x20 - uVar3) & 0x3f));
      }
      uVar2 = (uVar5 & 0xffefffffffffffff) + 0x1fffffffffff + (ulong)((uVar5 >> 0x2e & 1) != 0);
      uVar5 = uVar2 & 0x10000000000000;
      iVar4 = uVar3 + (uint)(uVar5 >> 0x34);
      if (0xf < iVar4) {
        return (Float<unsigned_int,_5,_6,_15,_2U>)0x7c0;
      }
      uVar3 = (uint)(uVar2 >> 0x2e);
      if (uVar5 != 0) {
        uVar3 = 0;
      }
      return (Float<unsigned_int,_5,_6,_15,_2U>)(uVar3 | iVar4 * 0x40 + 0x3c0U);
    }
  }
  return (Float<unsigned_int,_5,_6,_15,_2U>)0;
}

Assistant:

inline int				signBit			(void) const	{ return (int)(m_value >> (ExponentBits+MantissaBits)) & 1;					}